

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

bool headerNameValidImpl(QLatin1StringView name)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  byte *__it;
  ulong uVar4;
  long lVar5;
  byte *pbVar6;
  
  __it = (byte *)name.m_data;
  uVar4 = name.m_size;
  pbVar1 = __it + uVar4;
  pbVar6 = __it;
  if (0 < (long)uVar4 >> 2) {
    pbVar6 = __it + (uVar4 & 0xfffffffffffffffc);
    lVar5 = ((long)uVar4 >> 2) + 1;
    pbVar3 = __it + 3;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()
                        ((_Iter_negate<__7> *)(ulong)pbVar3[-3],(char *)__it);
      if (bVar2) {
        pbVar3 = pbVar3 + -3;
        goto LAB_0018f061;
      }
      bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()
                        ((_Iter_negate<__7> *)(ulong)pbVar3[-2],(char *)__it);
      if (bVar2) {
        pbVar3 = pbVar3 + -2;
        goto LAB_0018f061;
      }
      bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()
                        ((_Iter_negate<__7> *)(ulong)pbVar3[-1],(char *)__it);
      if (bVar2) {
        pbVar3 = pbVar3 + -1;
        goto LAB_0018f061;
      }
      bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()
                        ((_Iter_negate<__7> *)(ulong)*pbVar3,(char *)__it);
      if (bVar2) goto LAB_0018f061;
      lVar5 = lVar5 + -1;
      pbVar3 = pbVar3 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pbVar1 - (long)pbVar6;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pbVar3 = pbVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()
                            ((_Iter_negate<__7> *)(ulong)*pbVar6,(char *)__it), pbVar3 = pbVar6,
         bVar2)) goto LAB_0018f061;
      pbVar6 = pbVar6 + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()
                      ((_Iter_negate<__7> *)(ulong)*pbVar6,(char *)__it);
    pbVar3 = pbVar6;
    if (bVar2) goto LAB_0018f061;
    pbVar6 = pbVar6 + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()
                    ((_Iter_negate<__7> *)(ulong)*pbVar6,(char *)__it);
  pbVar3 = pbVar6;
  if (!bVar2) {
    pbVar3 = pbVar1;
  }
LAB_0018f061:
  return pbVar3 == pbVar1;
}

Assistant:

static bool headerNameValidImpl(QLatin1StringView name) noexcept
{
    return std::all_of(name.begin(), name.end(), isValidHttpHeaderNameChar);
}